

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void Handler_mode_S_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  int iVar1;
  PClassActor *pPVar2;
  long lVar3;
  
  lVar3 = 0x504;
  pPVar2 = info;
  if ((PClassActor *)APowerup::RegistrationInfo.MyClass != info) {
    do {
      pPVar2 = (PClassActor *)(pPVar2->super_PClass).ParentClass;
      if (pPVar2 == (PClassActor *)APowerup::RegistrationInfo.MyClass) break;
    } while (pPVar2 != (PClassActor *)0x0);
    if ((pPVar2 == (PClassActor *)0x0) &&
       (lVar3 = 0x510, (PClassActor *)APowerupGiver::RegistrationInfo.MyClass != info)) {
      do {
        info = (PClassActor *)(info->super_PClass).ParentClass;
        if (info == (PClassActor *)APowerupGiver::RegistrationInfo.MyClass) break;
      } while (info != (PClassActor *)0x0);
      if (info == (PClassActor *)0x0) {
        I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
        return;
      }
    }
  }
  iVar1 = FName::NameManager::FindName(&FName::NameData,params[1].s,false);
  *(int *)((long)&(defaults->super_AActor).super_DThinker.super_DObject._vptr_DObject + lVar3) =
       iVar1;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, mode, S, Inventory)
{
	PROP_STRING_PARM(str, 0);
	FName *pMode;
	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pMode = &((APowerup*)defaults)->Mode;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pMode = &((APowerupGiver*)defaults)->Mode;
	}
	else
	{
		I_Error("\"powerup.mode\" requires an actor of type \"Powerup\"\n");
		return;
	}
	*pMode = (FName)str;
}